

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFlushFinishTests.cpp
# Opt level: O3

IterateResult __thiscall
deqp::gles3::Functional::anon_unknown_0::FlushFinishCase::iterate(FlushFinishCase *this)

{
  undefined8 *puVar1;
  int *piVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  float fVar4;
  TestLog *pTVar5;
  int iVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  bool bVar10;
  bool bVar11;
  int *piVar12;
  uint uVar13;
  bool bVar14;
  int iVar15;
  int iVar16;
  deUint32 dVar17;
  value_type *__val;
  undefined4 extraout_var;
  RenderTarget *pRVar18;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  deUint64 dVar19;
  undefined4 extraout_var_03;
  deUint64 dVar20;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  ostream *poVar21;
  runtime_error *prVar22;
  undefined4 extraout_var_08;
  ulong uVar23;
  deUint64 dVar24;
  undefined4 extraout_var_09;
  deUint64 dVar25;
  int *__dest;
  size_t sVar26;
  TestError *this_00;
  int precision;
  long lVar27;
  char *pcVar28;
  int *piVar29;
  int iVar30;
  char *__s;
  __normal_iterator<deqp::gles3::Functional::(anonymous_namespace)::FlushFinishCase::Sample_*,_std::vector<deqp::gles3::Functional::(anonymous_namespace)::FlushFinishCase::Sample,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::FlushFinishCase::Sample>_>_>
  __i;
  ulong uVar31;
  uint uVar32;
  deUint64 *pdVar33;
  float fVar34;
  undefined8 extraout_XMM0_Qb;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  float fVar37;
  deUint8 tmp_4 [4];
  ScopedLogSection section_1;
  deUint8 tmp [4];
  size_type __dnew_2;
  ScopedLogSection section;
  deUint8 tmp_1 [4];
  deUint8 tmp_2 [4];
  deUint8 tmp_3 [4];
  size_type __dnew_4;
  vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> readTimes;
  vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> waitTimes;
  size_type __dnew_5;
  ostringstream msg;
  uint local_680;
  float fStack_674;
  LogNumber<float> local_660;
  undefined8 local_5f8;
  float fStack_5f0;
  float fStack_5ec;
  LogNumber<float> local_5e8;
  vector<deqp::gles3::Functional::(anonymous_namespace)::FlushFinishCase::Sample,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::FlushFinishCase::Sample>_>
  local_580;
  undefined1 local_568 [8];
  undefined1 auStack_560 [8];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_558;
  _Alloc_hider local_548;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_538;
  _Alloc_hider local_528;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_518;
  qpKeyValueTag local_508;
  float local_504;
  deInt64 local_500;
  ios_base local_4f0 [264];
  LogNumber<float> local_3e8;
  string local_380;
  string local_360;
  string local_340;
  string local_320;
  string local_300;
  string local_2e0;
  string local_2c0;
  string local_2a0;
  pointer local_280;
  string local_278;
  string local_258;
  vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> local_238;
  vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> local_220;
  string local_208;
  LineParameters local_1e8;
  LineParameters local_1d8;
  undefined8 uStack_1d0;
  string local_1c8;
  ostream local_1a8;
  
  local_580.
  super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::FlushFinishCase::Sample,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::FlushFinishCase::Sample>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)operator_new(0x640);
  local_580.
  super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::FlushFinishCase::Sample,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::FlushFinishCase::Sample>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_580.
       super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::FlushFinishCase::Sample,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::FlushFinishCase::Sample>_>
       ._M_impl.super__Vector_impl_data._M_start + 0x32;
  (local_580.
   super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::FlushFinishCase::Sample,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::FlushFinishCase::Sample>_>
   ._M_impl.super__Vector_impl_data._M_start)->waitTime = 0;
  (local_580.
   super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::FlushFinishCase::Sample,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::FlushFinishCase::Sample>_>
   ._M_impl.super__Vector_impl_data._M_start)->readPixelsTime = 0;
  *(undefined8 *)
   local_580.
   super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::FlushFinishCase::Sample,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::FlushFinishCase::Sample>_>
   ._M_impl.super__Vector_impl_data._M_start = 0;
  (local_580.
   super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::FlushFinishCase::Sample,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::FlushFinishCase::Sample>_>
   ._M_impl.super__Vector_impl_data._M_start)->submitTime = 0;
  lVar27 = 0x20;
  do {
    uVar7 = *(undefined8 *)
             local_580.
             super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::FlushFinishCase::Sample,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::FlushFinishCase::Sample>_>
             ._M_impl.super__Vector_impl_data._M_start;
    dVar19 = (local_580.
              super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::FlushFinishCase::Sample,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::FlushFinishCase::Sample>_>
              ._M_impl.super__Vector_impl_data._M_start)->submitTime;
    dVar20 = (local_580.
              super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::FlushFinishCase::Sample,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::FlushFinishCase::Sample>_>
              ._M_impl.super__Vector_impl_data._M_start)->readPixelsTime;
    pdVar33 = (deUint64 *)
              ((long)&(local_580.
                       super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::FlushFinishCase::Sample,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::FlushFinishCase::Sample>_>
                       ._M_impl.super__Vector_impl_data._M_start)->waitTime + lVar27);
    *pdVar33 = (local_580.
                super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::FlushFinishCase::Sample,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::FlushFinishCase::Sample>_>
                ._M_impl.super__Vector_impl_data._M_start)->waitTime;
    pdVar33[1] = dVar20;
    puVar1 = (undefined8 *)
             ((long)&(local_580.
                      super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::FlushFinishCase::Sample,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::FlushFinishCase::Sample>_>
                      ._M_impl.super__Vector_impl_data._M_start)->numDrawCalls + lVar27);
    *puVar1 = uVar7;
    puVar1[1] = dVar19;
    lVar27 = lVar27 + 0x20;
  } while (lVar27 != 0x640);
  local_580.
  super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::FlushFinishCase::Sample,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::FlushFinishCase::Sample>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_580.
       super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::FlushFinishCase::Sample,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::FlushFinishCase::Sample>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  tcu::warmupCPU();
  iVar15 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar27 = CONCAT44(extraout_var,iVar15);
  iVar16 = (**(code **)(lVar27 + 0x780))((this->m_program->m_program).m_program);
  pRVar18 = Context::getRenderTarget((this->super_TestCase).m_context);
  iVar15 = pRVar18->m_width;
  pRVar18 = Context::getRenderTarget((this->super_TestCase).m_context);
  if (iVar16 < 0) {
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,(char *)0x0,"posLoc >= 0",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fFlushFinishTests.cpp"
               ,0xfb);
    __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  iVar30 = pRVar18->m_height;
  if (0xff < iVar30) {
    iVar30 = 0x100;
  }
  iVar6 = 0x100;
  if (iVar15 < 0x100) {
    iVar6 = iVar15;
  }
  (**(code **)(lVar27 + 0x1a00))(0,0,iVar6,iVar30);
  (**(code **)(lVar27 + 0x1680))((this->m_program->m_program).m_program);
  (**(code **)(lVar27 + 0x610))(iVar16);
  (**(code **)(lVar27 + 0x19f0))
            (iVar16,2,0x1406,0,0,
             Functional::(anonymous_namespace)::FlushFinishCase::setupRenderState()::s_positions);
  (**(code **)(lVar27 + 0x5e0))(0xbe2);
  (**(code **)(lVar27 + 0x120))(1,1);
  (**(code **)(lVar27 + 0x100))(0x8006);
  dVar17 = (**(code **)(lVar27 + 0x800))();
  glu::checkError(dVar17,"Failed to set up render state",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fFlushFinishTests.cpp"
                  ,0x104);
  iVar15 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  (**(code **)(CONCAT44(extraout_var_00,iVar15) + 0x14f0))(this->m_iterCountLoc,1);
  render((FlushFinishCase *)((this->super_TestCase).m_context)->m_renderCtx,1);
  iVar15 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  (**(code **)(CONCAT44(extraout_var_01,iVar15) + 0x1220))(0,0,1,1,0x1908,0x1401,local_568);
  tcu::TestContext::touchWatchdog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  pTVar5 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  local_568 = (undefined1  [8])(auStack_560 + 8);
  aStack_558._8_4_ = 0x496e6f69;
  aStack_558._12_3_ = 0x6f666e;
  aStack_558._M_allocated_capacity._0_4_ = 0x696c6143;
  aStack_558._M_allocated_capacity._4_4_ = 0x74617262;
  auStack_560._0_4_ = 0xf;
  auStack_560._4_4_ = 0;
  aStack_558._M_local_buf[0xf] = '\0';
  local_660.m_name._M_dataplus._M_p = (pointer)&local_660.m_name.field_2;
  local_5e8.m_name._M_dataplus._M_p = &DAT_00000010;
  local_660.m_name._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_660,(ulong)&local_5e8);
  local_660.m_name.field_2._M_allocated_capacity._0_4_ = SUB84(local_5e8.m_name._M_dataplus._M_p,0);
  local_660.m_name.field_2._M_allocated_capacity._4_4_ =
       (undefined4)((ulong)local_5e8.m_name._M_dataplus._M_p >> 0x20);
  builtin_strncpy(local_660.m_name._M_dataplus._M_p,"Calibration info",0x10);
  local_660.m_name._M_string_length = (size_type)local_5e8.m_name._M_dataplus._M_p;
  local_660.m_name._M_dataplus._M_p[(long)local_5e8.m_name._M_dataplus._M_p] = '\0';
  tcu::ScopedLogSection::ScopedLogSection
            ((ScopedLogSection *)&local_380,pTVar5,(string *)local_568,&local_660.m_name);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_660.m_name._M_dataplus._M_p != &local_660.m_name.field_2) {
    operator_delete(local_660.m_name._M_dataplus._M_p,
                    CONCAT44(local_660.m_name.field_2._M_allocated_capacity._4_4_,
                             local_660.m_name.field_2._M_allocated_capacity._0_4_) + 1);
  }
  if (local_568 != (undefined1  [8])(auStack_560 + 8)) {
    operator_delete((void *)local_568,
                    CONCAT44(aStack_558._M_allocated_capacity._4_4_,
                             aStack_558._M_allocated_capacity._0_4_) + 1);
  }
  local_568 = (undefined1  [8])
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)auStack_560);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)auStack_560,"Calibrating shader iteration count, target duration = ",0x36);
  std::ostream::_M_insert<unsigned_long>((ulong)auStack_560);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_560," us",3);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_568,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)auStack_560);
  std::ios_base::~ios_base(local_4f0);
  uVar23 = 0;
  iVar15 = 1;
  iVar16 = 1;
  while( true ) {
    iVar30 = iVar15;
    iVar15 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
    (**(code **)(CONCAT44(extraout_var_02,iVar15) + 0x14f0))(this->m_iterCountLoc,iVar30);
    render((FlushFinishCase *)((this->super_TestCase).m_context)->m_renderCtx,1);
    dVar19 = deGetMicroseconds();
    iVar15 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
    (**(code **)(CONCAT44(extraout_var_03,iVar15) + 0x1220))(0,0,1,1,0x1908,0x1401,&local_300);
    dVar20 = deGetMicroseconds();
    local_568 = (undefined1  [8])
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)auStack_560);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_560,"Duration with ",0xe);
    std::ostream::operator<<((ostringstream *)auStack_560,iVar30);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_560," iterations = ",0xe);
    uVar31 = dVar20 - dVar19;
    std::ostream::_M_insert<unsigned_long>((ulong)auStack_560);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_560," us",3);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_568,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)auStack_560);
    std::ios_base::~ios_base(local_4f0);
    if (0x5dc < uVar31) break;
    if (0x3ff < iVar30) goto LAB_0127a397;
    uVar23 = uVar31;
    iVar15 = iVar30 * 2;
    iVar16 = iVar30;
  }
  if (1 < iVar30) {
    fVar37 = (float)(uVar31 - uVar23) / (float)(iVar30 - iVar16);
    fVar37 = floorf((1500.0 - ((float)(long)uVar23 - (float)iVar16 * fVar37)) / fVar37);
    iVar30 = (int)fVar37;
    if (0x3ff < iVar30) {
      iVar30 = 0x400;
    }
    if (iVar30 < 2) {
      iVar30 = 1;
    }
  }
LAB_0127a397:
  pTVar5 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  local_660.m_name._M_dataplus._M_p = (pointer)&local_660.m_name.field_2;
  local_660.m_name.field_2._8_4_ = 0x6f437265;
  local_660.m_name.field_2._M_local_buf[0xc] = 'u';
  local_660.m_name.field_2._13_2_ = 0x746e;
  local_660.m_name.field_2._M_allocated_capacity._0_4_ = 0x64616853;
  local_660.m_name.field_2._M_allocated_capacity._4_4_ = 0x74497265;
  local_660.m_name._M_string_length = 0xf;
  local_660.m_name.field_2._M_local_buf[0xf] = '\0';
  local_5e8.m_name._M_dataplus._M_p = (pointer)&local_5e8.m_name.field_2;
  local_3e8.m_name._M_dataplus._M_p = &DAT_00000016;
  local_5e8.m_name._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_5e8,(ulong)&local_3e8);
  local_5e8.m_name.field_2._M_allocated_capacity = (size_type)local_3e8.m_name._M_dataplus._M_p;
  *(undefined8 *)local_5e8.m_name._M_dataplus._M_p = 0x6920726564616853;
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_5e8.m_name._M_dataplus._M_p + 8) = 't';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_5e8.m_name._M_dataplus._M_p + 9) = 'e';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_5e8.m_name._M_dataplus._M_p + 10) = 'r';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_5e8.m_name._M_dataplus._M_p + 0xb) = 'a';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_5e8.m_name._M_dataplus._M_p + 0xc) = 't';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_5e8.m_name._M_dataplus._M_p + 0xd) = 'i';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_5e8.m_name._M_dataplus._M_p + 0xe) = 'o';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_5e8.m_name._M_dataplus._M_p + 0xf) = 'n';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_5e8.m_name._M_dataplus._M_p + 0xe) = 'o';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_5e8.m_name._M_dataplus._M_p + 0xf) = 'n';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_5e8.m_name._M_dataplus._M_p + 0x10) = ' ';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_5e8.m_name._M_dataplus._M_p + 0x11) = 'c';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_5e8.m_name._M_dataplus._M_p + 0x12) = 'o';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_5e8.m_name._M_dataplus._M_p + 0x13) = 'u';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_5e8.m_name._M_dataplus._M_p + 0x14) = 'n';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_5e8.m_name._M_dataplus._M_p + 0x15) = 't';
  local_5e8.m_name._M_string_length = (size_type)local_3e8.m_name._M_dataplus._M_p;
  local_5e8.m_name._M_dataplus._M_p[(long)local_3e8.m_name._M_dataplus._M_p] = '\0';
  local_3e8.m_name._M_dataplus._M_p = (pointer)&local_3e8.m_name.field_2;
  local_3e8.m_name._M_string_length = 0;
  local_3e8.m_name.field_2._M_local_buf[0] = '\0';
  tcu::LogNumber<long>::LogNumber
            ((LogNumber<long> *)local_568,&local_660.m_name,&local_5e8.m_name,&local_3e8.m_name,
             QP_KEY_TAG_NONE,(long)iVar30);
  tcu::TestLog::writeInteger
            (pTVar5,(char *)local_568,local_548._M_p,local_528._M_p,local_508,local_500);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_528._M_p != &local_518) {
    operator_delete(local_528._M_p,local_518._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_548._M_p != &local_538) {
    operator_delete(local_548._M_p,local_538._M_allocated_capacity + 1);
  }
  if (local_568 != (undefined1  [8])(auStack_560 + 8)) {
    operator_delete((void *)local_568,
                    CONCAT44(aStack_558._M_allocated_capacity._4_4_,
                             aStack_558._M_allocated_capacity._0_4_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3e8.m_name._M_dataplus._M_p != &local_3e8.m_name.field_2) {
    operator_delete(local_3e8.m_name._M_dataplus._M_p,
                    CONCAT71(local_3e8.m_name.field_2._M_allocated_capacity._1_7_,
                             local_3e8.m_name.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5e8.m_name._M_dataplus._M_p != &local_5e8.m_name.field_2) {
    operator_delete(local_5e8.m_name._M_dataplus._M_p,
                    (ulong)(local_5e8.m_name.field_2._M_allocated_capacity + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_660.m_name._M_dataplus._M_p != &local_660.m_name.field_2) {
    operator_delete(local_660.m_name._M_dataplus._M_p,
                    CONCAT44(local_660.m_name.field_2._M_allocated_capacity._4_4_,
                             local_660.m_name.field_2._M_allocated_capacity._0_4_) + 1);
  }
  local_568 = (undefined1  [8])
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)auStack_560);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)auStack_560,"Calibrating maximum draw call count, target duration = ",0x37);
  std::ostream::operator<<((ostringstream *)auStack_560,150000);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_560," us",3);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_568,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)auStack_560);
  std::ios_base::~ios_base(local_4f0);
  iVar15 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  (**(code **)(CONCAT44(extraout_var_04,iVar15) + 0x14f0))(this->m_iterCountLoc,iVar30);
  uVar23 = 0;
  uVar13 = 1;
  uVar32 = 1;
  while( true ) {
    local_680 = uVar13;
    render((FlushFinishCase *)((this->super_TestCase).m_context)->m_renderCtx,local_680);
    dVar19 = deGetMicroseconds();
    iVar15 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
    (**(code **)(CONCAT44(extraout_var_05,iVar15) + 0x1220))(0,0,1,1,0x1908,0x1401,&local_2c0);
    dVar20 = deGetMicroseconds();
    local_568 = (undefined1  [8])
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)auStack_560);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_560,"Duration with ",0xe);
    std::ostream::operator<<((ostringstream *)auStack_560,local_680);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_560," draw calls = ",0xe);
    uVar31 = dVar20 - dVar19;
    std::ostream::_M_insert<unsigned_long>((ulong)auStack_560);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_560," us",3);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_568,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)auStack_560);
    std::ios_base::~ios_base(local_4f0);
    if (150000 < uVar31) break;
    if (0xfffff < (int)local_680) goto LAB_0127a81a;
    uVar23 = uVar31;
    uVar13 = local_680 * 2;
    uVar32 = local_680;
  }
  if (1 < (int)local_680) {
    fVar37 = (float)(uVar31 - uVar23) / (float)(int)(local_680 - uVar32);
    fVar37 = floorf((150000.0 - ((float)(long)uVar23 - (float)(int)uVar32 * fVar37)) / fVar37);
    local_680 = (uint)fVar37;
    if (0xfffff < (int)local_680) {
      local_680 = 0x100000;
    }
    if ((int)local_680 < 2) {
      local_680 = 1;
    }
  }
LAB_0127a81a:
  pTVar5 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  local_660.m_name._M_dataplus._M_p = (pointer)&local_660.m_name.field_2;
  local_660.m_name.field_2._M_allocated_capacity._0_4_ = 0x4478614d;
  local_660.m_name.field_2._M_allocated_capacity._4_4_ = 0x43776172;
  local_660.m_name.field_2._8_4_ = 0x736c6c61;
  local_660.m_name._M_string_length = 0xc;
  local_660.m_name.field_2._M_local_buf[0xc] = '\0';
  local_5e8.m_name._M_dataplus._M_p = (pointer)&local_5e8.m_name.field_2;
  local_320._M_dataplus._M_p = (pointer)0x1c;
  local_5e8.m_name._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_5e8,(ulong)&local_320);
  local_5e8.m_name.field_2._M_allocated_capacity = (size_type)local_320._M_dataplus._M_p;
  builtin_strncpy((char *)((long)((long)local_5e8.m_name._M_dataplus._M_p + 8) + 4),"er of dr",8);
  builtin_strncpy((char *)((long)((long)local_5e8.m_name._M_dataplus._M_p + 0x10) + 4),"aw calls",8)
  ;
  *(undefined8 *)local_5e8.m_name._M_dataplus._M_p = 0x206d756d6978614d;
  *(undefined8 *)((long)local_5e8.m_name._M_dataplus._M_p + 8) = 0x6f207265626d756e;
  local_5e8.m_name._M_string_length = (size_type)local_320._M_dataplus._M_p;
  local_320._M_dataplus._M_p[(long)local_5e8.m_name._M_dataplus._M_p] = '\0';
  local_3e8.m_name._M_dataplus._M_p = (pointer)&local_3e8.m_name.field_2;
  local_3e8.m_name._M_string_length = 0;
  local_3e8.m_name.field_2._M_local_buf[0] = '\0';
  tcu::LogNumber<long>::LogNumber
            ((LogNumber<long> *)local_568,&local_660.m_name,&local_5e8.m_name,&local_3e8.m_name,
             QP_KEY_TAG_NONE,(long)(int)local_680);
  tcu::TestLog::writeInteger
            (pTVar5,(char *)local_568,local_548._M_p,local_528._M_p,local_508,local_500);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_528._M_p != &local_518) {
    operator_delete(local_528._M_p,local_518._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_548._M_p != &local_538) {
    operator_delete(local_548._M_p,local_538._M_allocated_capacity + 1);
  }
  if (local_568 != (undefined1  [8])(auStack_560 + 8)) {
    operator_delete((void *)local_568,
                    CONCAT44(aStack_558._M_allocated_capacity._4_4_,
                             aStack_558._M_allocated_capacity._0_4_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3e8.m_name._M_dataplus._M_p != &local_3e8.m_name.field_2) {
    operator_delete(local_3e8.m_name._M_dataplus._M_p,
                    CONCAT71(local_3e8.m_name.field_2._M_allocated_capacity._1_7_,
                             local_3e8.m_name.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5e8.m_name._M_dataplus._M_p != &local_5e8.m_name.field_2) {
    operator_delete(local_5e8.m_name._M_dataplus._M_p,
                    local_5e8.m_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_660.m_name._M_dataplus._M_p != &local_660.m_name.field_2) {
    operator_delete(local_660.m_name._M_dataplus._M_p,
                    CONCAT44(local_660.m_name.field_2._M_allocated_capacity._4_4_,
                             local_660.m_name.field_2._M_allocated_capacity._0_4_) + 1);
  }
  if ((int)local_680 < 10) {
    prVar22 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_568 = (undefined1  [8])(auStack_560 + 8);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_568,"Calibration failed, maximum draw call count is too low","");
    std::runtime_error::runtime_error(prVar22,(string *)local_568);
    *(undefined ***)prVar22 = &PTR__runtime_error_02152570;
    __cxa_throw(prVar22,&Functional::(anonymous_namespace)::CalibrationFailedException::typeinfo,
                std::runtime_error::~runtime_error);
  }
  tcu::TestLog::endSection((TestLog *)local_380._M_dataplus._M_p);
  iVar15 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  (**(code **)(CONCAT44(extraout_var_06,iVar15) + 0x14f0))(this->m_iterCountLoc,iVar30);
  iVar15 = 3;
  do {
    render((FlushFinishCase *)((this->super_TestCase).m_context)->m_renderCtx,local_680);
    dVar19 = deGetMicroseconds();
    iVar16 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
    (**(code **)(CONCAT44(extraout_var_07,iVar16) + 0x1220))(0,0,1,1,0x1908,0x1401,&local_2a0);
    dVar20 = deGetMicroseconds();
    lVar27 = dVar20 - dVar19;
    auVar36._8_4_ = (int)((ulong)lVar27 >> 0x20);
    auVar36._0_8_ = lVar27;
    auVar36._12_4_ = 0x45300000;
    fVar37 = (float)(((auVar36._8_8_ - 1.9342813113834067e+25) +
                     ((double)CONCAT44(0x43300000,(int)lVar27) - 4503599627370496.0)) / 150000.0) +
             -1.0;
    if ((fVar37 < -0.1) || (0.1 <= fVar37)) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>
                (&local_1a8,"ERROR: Unstable performance, got ",0x21);
      poVar21 = std::ostream::_M_insert<unsigned_long>((ulong)&local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>(poVar21," us read time, ",0xf);
      de::floatToString_abi_cxx11_((string *)local_568,(de *)&DAT_00000001,fVar37 * 100.0,precision)
      ;
      poVar21 = std::__ostream_insert<char,std::char_traits<char>>
                          (poVar21,(char *)local_568,CONCAT44(auStack_560._4_4_,auStack_560._0_4_));
      std::__ostream_insert<char,std::char_traits<char>>(poVar21,"% diff to estimated ",0x14);
      poVar21 = (ostream *)std::ostream::operator<<(poVar21,150000);
      std::__ostream_insert<char,std::char_traits<char>>(poVar21," us",3);
      if (local_568 != (undefined1  [8])(auStack_560 + 8)) {
        operator_delete((void *)local_568,
                        CONCAT44(aStack_558._M_allocated_capacity._4_4_,
                                 aStack_558._M_allocated_capacity._0_4_) + 1);
      }
      prVar22 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar22,(string *)local_568);
      *(undefined ***)prVar22 = &PTR__runtime_error_02152570;
      __cxa_throw(prVar22,&Functional::(anonymous_namespace)::CalibrationFailedException::typeinfo,
                  std::runtime_error::~runtime_error);
    }
    iVar15 = iVar15 + -1;
  } while (iVar15 != 0);
  deRandom_init((deRandom *)local_568,0x7b);
  iVar15 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  (**(code **)(CONCAT44(extraout_var_08,iVar15) + 0x14f0))(this->m_iterCountLoc,iVar30);
  local_280 = local_580.
              super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::FlushFinishCase::Sample,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::FlushFinishCase::Sample>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  local_5f8 = local_580.
              super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::FlushFinishCase::Sample,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::FlushFinishCase::Sample>_>
              ._M_impl.super__Vector_impl_data._M_start;
  uVar23 = (long)local_580.
                 super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::FlushFinishCase::Sample,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::FlushFinishCase::Sample>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)local_580.
                 super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::FlushFinishCase::Sample,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::FlushFinishCase::Sample>_>
                 ._M_impl.super__Vector_impl_data._M_start;
  if (uVar23 != 0) {
    lVar27 = ((long)uVar23 >> 5) + (ulong)((long)uVar23 >> 5 == 0);
    pdVar33 = &(local_580.
                super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::FlushFinishCase::Sample,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::FlushFinishCase::Sample>_>
                ._M_impl.super__Vector_impl_data._M_start)->readPixelsTime;
    do {
      dVar17 = deRandom_getUint32((deRandom *)local_568);
      dVar19 = deGetMicroseconds();
      iVar16 = dVar17 % local_680 + 1;
      render((FlushFinishCase *)((this->super_TestCase).m_context)->m_renderCtx,iVar16);
      dVar20 = deGetMicroseconds();
      (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[5])();
      dVar24 = deGetMicroseconds();
      iVar15 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
      (**(code **)(CONCAT44(extraout_var_09,iVar15) + 0x1220))(0,0,1,1,0x1908,0x1401,&local_660);
      dVar25 = deGetMicroseconds();
      ((Sample *)(pdVar33 + -3))->numDrawCalls = iVar16;
      pdVar33[-2] = dVar20 - dVar19;
      pdVar33[-1] = dVar24 - dVar20;
      *pdVar33 = dVar25 - dVar24;
      tcu::TestContext::touchWatchdog
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
      pdVar33 = pdVar33 + 4;
      lVar27 = lVar27 + -1;
    } while (lVar27 != 0);
  }
  getPointsFromSamples(&local_220,&local_580,0x10);
  getPointsFromSamples(&local_238,&local_580,0x18);
  local_1d8 = deqp::gls::theilSenLinearRegression(&local_220);
  uStack_1d0 = extraout_XMM0_Qb;
  local_1e8 = deqp::gls::theilSenLinearRegression(&local_238);
  local_568 = (undefined1  [8])(auStack_560 + 8);
  aStack_558._M_allocated_capacity._0_4_ = 0x706d6153;
  auStack_560._0_4_ = 7;
  auStack_560._4_4_ = 0;
  aStack_558._M_allocated_capacity._4_4_ = 0x73656c;
  paVar3 = &local_660.m_name.field_2;
  local_660.m_name.field_2._M_allocated_capacity._0_4_ = 0x706d6153;
  local_660.m_name._M_string_length = 7;
  local_660.m_name.field_2._M_allocated_capacity._4_4_ = 0x73656c;
  local_660.m_name._M_dataplus._M_p = (pointer)paVar3;
  tcu::ScopedLogSection::ScopedLogSection
            ((ScopedLogSection *)&local_5e8,
             ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log,
             (string *)local_568,&local_660.m_name);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_660.m_name._M_dataplus._M_p != paVar3) {
    operator_delete(local_660.m_name._M_dataplus._M_p,
                    CONCAT44(local_660.m_name.field_2._M_allocated_capacity._4_4_,
                             local_660.m_name.field_2._M_allocated_capacity._0_4_) + 1);
  }
  if (local_568 != (undefined1  [8])(auStack_560 + 8)) {
    operator_delete((void *)local_568,
                    CONCAT44(aStack_558._M_allocated_capacity._4_4_,
                             aStack_558._M_allocated_capacity._0_4_) + 1);
  }
  if (0x7fffffffffffffe0 < uVar23) {
    std::__throw_length_error("cannot create std::vector larger than max_size()");
  }
  if (local_280 != local_5f8) {
    __dest = (int *)operator_new(uVar23);
    memcpy(__dest,local_5f8,uVar23);
    piVar2 = (int *)((long)__dest + uVar23);
    lVar27 = 0x3f;
    if (uVar23 >> 5 != 0) {
      for (; (uVar23 >> 5) >> lVar27 == 0; lVar27 = lVar27 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<deqp::gles3::Functional::(anonymous_namespace)::FlushFinishCase::Sample*,std::vector<deqp::gles3::Functional::(anonymous_namespace)::FlushFinishCase::Sample,std::allocator<deqp::gles3::Functional::(anonymous_namespace)::FlushFinishCase::Sample>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<deqp::gles3::Functional::(anonymous_namespace)::CompareSampleDrawCount>>
              (__dest,piVar2,((uint)lVar27 ^ 0x3f) * 2 ^ 0x7e);
    if (uVar23 < 0x201) {
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<deqp::gles3::Functional::(anonymous_namespace)::FlushFinishCase::Sample*,std::vector<deqp::gles3::Functional::(anonymous_namespace)::FlushFinishCase::Sample,std::allocator<deqp::gles3::Functional::(anonymous_namespace)::FlushFinishCase::Sample>>>,__gnu_cxx::__ops::_Iter_comp_iter<deqp::gles3::Functional::(anonymous_namespace)::CompareSampleDrawCount>>
                (__dest,piVar2);
    }
    else {
      piVar29 = __dest + 0x80;
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<deqp::gles3::Functional::(anonymous_namespace)::FlushFinishCase::Sample*,std::vector<deqp::gles3::Functional::(anonymous_namespace)::FlushFinishCase::Sample,std::allocator<deqp::gles3::Functional::(anonymous_namespace)::FlushFinishCase::Sample>>>,__gnu_cxx::__ops::_Iter_comp_iter<deqp::gles3::Functional::(anonymous_namespace)::CompareSampleDrawCount>>
                (__dest,piVar29);
      do {
        iVar15 = *piVar29;
        uVar7 = *(undefined8 *)(piVar29 + 6);
        aStack_558._M_allocated_capacity._0_4_ =
             (undefined4)((ulong)*(undefined8 *)(piVar29 + 4) >> 0x20);
        aStack_558._M_allocated_capacity._4_4_ = (undefined4)uVar7;
        aStack_558._8_4_ = (undefined4)((ulong)uVar7 >> 0x20);
        uVar8 = *(undefined8 *)(piVar29 + 1);
        uVar9 = *(undefined8 *)(piVar29 + 3);
        auStack_560._0_4_ = (undefined4)uVar9;
        auStack_560._4_4_ = (undefined4)((ulong)uVar9 >> 0x20);
        iVar16 = piVar29[-8];
        piVar12 = piVar29;
        while (iVar15 < iVar16) {
          *(undefined8 *)(piVar12 + 4) = *(undefined8 *)(piVar12 + -4);
          *(undefined8 *)(piVar12 + 6) = *(undefined8 *)(piVar12 + -2);
          *(undefined8 *)piVar12 = *(undefined8 *)(piVar12 + -8);
          *(undefined8 *)(piVar12 + 2) = *(undefined8 *)(piVar12 + -6);
          iVar16 = piVar12[-0x10];
          piVar12 = piVar12 + -8;
        }
        *piVar12 = iVar15;
        *(undefined8 *)(piVar12 + 1) = uVar8;
        *(undefined8 *)(piVar12 + 3) = uVar9;
        *(ulong *)(piVar12 + 4) = CONCAT44(aStack_558._M_allocated_capacity._0_4_,auStack_560._4_4_)
        ;
        *(undefined8 *)(piVar12 + 6) = uVar7;
        piVar29 = piVar29 + 8;
      } while (piVar29 != piVar2);
    }
    piVar29 = __dest;
    do {
      local_568 = (undefined1  [8])
                  ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)auStack_560);
      std::ostream::operator<<((ostringstream *)auStack_560,*piVar29);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_560," calls:\t",8);
      std::ostream::_M_insert<unsigned_long>((ulong)auStack_560);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_560," us submit,\t",0xc)
      ;
      std::ostream::_M_insert<unsigned_long>((ulong)auStack_560);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_560," us wait,\t",10);
      std::ostream::_M_insert<unsigned_long>((ulong)auStack_560);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_560," us read",8);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_568,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)auStack_560);
      std::ios_base::~ios_base(local_4f0);
      piVar29 = piVar29 + 8;
    } while (piVar29 != piVar2);
    operator_delete(__dest,uVar23);
  }
  tcu::TestLog::endSection((TestLog *)local_5e8.m_name._M_dataplus._M_p);
  pTVar5 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  local_320._M_dataplus._M_p = (pointer)&local_320.field_2;
  local_320.field_2._M_allocated_capacity._0_7_ = 0x656f4374696157;
  local_320.field_2._M_local_buf[7] = 'f';
  local_320.field_2._8_7_ = 0x746e6569636966;
  local_320._M_string_length = 0xf;
  local_320.field_2._M_local_buf[0xf] = '\0';
  local_380._M_dataplus._M_p = (pointer)&local_380.field_2;
  local_660.m_name._M_dataplus._M_p = &DAT_00000010;
  local_380._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_380,(ulong)&local_660);
  local_380.field_2._M_allocated_capacity = (size_type)local_660.m_name._M_dataplus._M_p;
  *(undefined8 *)local_380._M_dataplus._M_p = 0x656f632074696157;
  *(undefined8 *)((long)local_380._M_dataplus._M_p + 8) = 0x746e656963696666;
  local_380._M_string_length = (size_type)local_660.m_name._M_dataplus._M_p;
  local_660.m_name._M_dataplus._M_p[(long)local_380._M_dataplus._M_p] = '\0';
  local_2a0._M_dataplus._M_p = (pointer)&local_2a0.field_2;
  local_2a0._M_string_length = 0;
  local_2a0.field_2._M_local_buf[0] = '\0';
  tcu::LogNumber<float>::LogNumber
            ((LogNumber<float> *)local_568,&local_320,&local_380,&local_2a0,QP_KEY_TAG_NONE,
             local_1d8.coefficient);
  tcu::TestLog::writeFloat
            (pTVar5,(char *)local_568,local_548._M_p,local_528._M_p,local_508,local_504);
  local_2c0._M_dataplus._M_p = (pointer)&local_2c0.field_2;
  local_2c0.field_2._M_allocated_capacity._0_7_ = 0x656f4364616552;
  local_2c0.field_2._M_local_buf[7] = 'f';
  local_2c0.field_2._8_7_ = 0x746e6569636966;
  local_2c0._M_string_length = 0xf;
  local_2c0.field_2._M_local_buf[0xf] = '\0';
  local_300._M_dataplus._M_p = (pointer)&local_300.field_2;
  local_5e8.m_name._M_dataplus._M_p = &DAT_00000010;
  local_300._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_300,(ulong)&local_5e8);
  local_300.field_2._M_allocated_capacity = (size_type)local_5e8.m_name._M_dataplus._M_p;
  builtin_strncpy(local_300._M_dataplus._M_p,"Read coefficient",0x10);
  local_300._M_string_length = (size_type)local_5e8.m_name._M_dataplus._M_p;
  local_300._M_dataplus._M_p[(long)local_5e8.m_name._M_dataplus._M_p] = '\0';
  local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
  local_258._M_string_length = 0;
  local_258.field_2._M_local_buf[0] = '\0';
  tcu::LogNumber<float>::LogNumber
            (&local_660,&local_2c0,&local_300,&local_258,QP_KEY_TAG_NONE,local_1e8.coefficient);
  tcu::TestLog::writeFloat
            (pTVar5,local_660.m_name._M_dataplus._M_p,local_660.m_desc._M_dataplus._M_p,
             local_660.m_unit._M_dataplus._M_p,local_660.m_tag,local_660.m_value);
  local_3e8.m_name._M_dataplus._M_p = (pointer)0x19;
  local_340._M_dataplus._M_p = (pointer)&local_340.field_2;
  local_340._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_340,(ulong)&local_3e8);
  local_340.field_2._M_allocated_capacity = (size_type)local_3e8.m_name._M_dataplus._M_p;
  builtin_strncpy(local_340._M_dataplus._M_p,"NormalizedWaitCoefficient",0x19);
  local_340._M_string_length = (size_type)local_3e8.m_name._M_dataplus._M_p;
  local_340._M_dataplus._M_p[(long)local_3e8.m_name._M_dataplus._M_p] = '\0';
  local_2e0._M_dataplus._M_p = (pointer)&local_2e0.field_2;
  local_3e8.m_name._M_dataplus._M_p = (char *)0x1b;
  local_2e0._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_2e0,(ulong)&local_3e8);
  fVar37 = (float)(int)local_680;
  auVar35._0_4_ = fVar37 * local_1d8.coefficient;
  auVar35._4_4_ = fVar37 * local_1e8.coefficient;
  auVar35._8_4_ = fVar37 * (float)uStack_1d0;
  auVar35._12_4_ = fVar37 * uStack_1d0._4_4_;
  auVar36 = divps(auVar35,_DAT_01c1dee0);
  local_2e0.field_2._M_allocated_capacity = (size_type)local_3e8.m_name._M_dataplus._M_p;
  builtin_strncpy(local_2e0._M_dataplus._M_p,"Normalized wait coefficient",0x1b);
  local_2e0._M_string_length = (size_type)local_3e8.m_name._M_dataplus._M_p;
  local_2e0._M_dataplus._M_p[(long)local_3e8.m_name._M_dataplus._M_p] = '\0';
  local_1c8._M_string_length = 0;
  local_1c8.field_2._M_local_buf[0] = '\0';
  fVar37 = auVar36._0_4_;
  local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
  tcu::LogNumber<float>::LogNumber
            (&local_5e8,&local_340,&local_2e0,&local_1c8,QP_KEY_TAG_NONE,fVar37);
  tcu::TestLog::writeFloat
            (pTVar5,local_5e8.m_name._M_dataplus._M_p,local_5e8.m_desc._M_dataplus._M_p,
             local_5e8.m_unit._M_dataplus._M_p,local_5e8.m_tag,local_5e8.m_value);
  local_278._M_dataplus._M_p = (pointer)0x19;
  local_360._M_dataplus._M_p = (pointer)&local_360.field_2;
  local_360._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_360,(ulong)&local_278);
  local_360.field_2._M_allocated_capacity = (size_type)local_278._M_dataplus._M_p;
  builtin_strncpy(local_360._M_dataplus._M_p,"NormalizedReadCoefficient",0x19);
  local_360._M_string_length = (size_type)local_278._M_dataplus._M_p;
  local_360._M_dataplus._M_p[(long)local_278._M_dataplus._M_p] = '\0';
  local_208._M_dataplus._M_p = (pointer)0x1b;
  local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
  local_278._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_278,(ulong)&local_208);
  local_278.field_2._M_allocated_capacity = (size_type)local_208._M_dataplus._M_p;
  builtin_strncpy(local_278._M_dataplus._M_p,"Normalized read coefficient",0x1b);
  local_278._M_string_length = (size_type)local_208._M_dataplus._M_p;
  local_278._M_dataplus._M_p[(long)local_208._M_dataplus._M_p] = '\0';
  local_208._M_string_length = 0;
  local_208.field_2._M_local_buf[0] = '\0';
  fStack_674 = auVar36._4_4_;
  local_5f8 = (pointer)CONCAT44(fStack_674,fStack_674);
  fStack_5f0 = fStack_674;
  fStack_5ec = fStack_674;
  local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
  tcu::LogNumber<float>::LogNumber
            (&local_3e8,&local_360,&local_278,&local_208,QP_KEY_TAG_NONE,fStack_674);
  tcu::TestLog::writeFloat
            (pTVar5,local_3e8.m_name._M_dataplus._M_p,local_3e8.m_desc._M_dataplus._M_p,
             local_3e8.m_unit._M_dataplus._M_p,local_3e8.m_tag,local_3e8.m_value);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3e8.m_unit._M_dataplus._M_p != &local_3e8.m_unit.field_2) {
    operator_delete(local_3e8.m_unit._M_dataplus._M_p,
                    local_3e8.m_unit.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3e8.m_desc._M_dataplus._M_p != &local_3e8.m_desc.field_2) {
    operator_delete(local_3e8.m_desc._M_dataplus._M_p,
                    local_3e8.m_desc.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3e8.m_name._M_dataplus._M_p != &local_3e8.m_name.field_2) {
    operator_delete(local_3e8.m_name._M_dataplus._M_p,
                    CONCAT71(local_3e8.m_name.field_2._M_allocated_capacity._1_7_,
                             local_3e8.m_name.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208._M_dataplus._M_p != &local_208.field_2) {
    operator_delete(local_208._M_dataplus._M_p,
                    CONCAT71(local_208.field_2._M_allocated_capacity._1_7_,
                             local_208.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_278._M_dataplus._M_p != &local_278.field_2) {
    operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_360._M_dataplus._M_p != &local_360.field_2) {
    operator_delete(local_360._M_dataplus._M_p,(ulong)(local_360.field_2._M_allocated_capacity + 1))
    ;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5e8.m_unit._M_dataplus._M_p != &local_5e8.m_unit.field_2) {
    operator_delete(local_5e8.m_unit._M_dataplus._M_p,
                    local_5e8.m_unit.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5e8.m_desc._M_dataplus._M_p != &local_5e8.m_desc.field_2) {
    operator_delete(local_5e8.m_desc._M_dataplus._M_p,
                    local_5e8.m_desc.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5e8.m_name._M_dataplus._M_p != &local_5e8.m_name.field_2) {
    operator_delete(local_5e8.m_name._M_dataplus._M_p,
                    local_5e8.m_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
    operator_delete(local_1c8._M_dataplus._M_p,
                    CONCAT71(local_1c8.field_2._M_allocated_capacity._1_7_,
                             local_1c8.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
    operator_delete(local_2e0._M_dataplus._M_p,(ulong)(local_2e0.field_2._M_allocated_capacity + 1))
    ;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_340._M_dataplus._M_p != &local_340.field_2) {
    operator_delete(local_340._M_dataplus._M_p,(ulong)(local_340.field_2._M_allocated_capacity + 1))
    ;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_660.m_unit._M_dataplus._M_p != &local_660.m_unit.field_2) {
    operator_delete(local_660.m_unit._M_dataplus._M_p,
                    local_660.m_unit.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_660.m_desc._M_dataplus._M_p != &local_660.m_desc.field_2) {
    operator_delete(local_660.m_desc._M_dataplus._M_p,
                    local_660.m_desc.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_660.m_name._M_dataplus._M_p != &local_660.m_name.field_2) {
    operator_delete(local_660.m_name._M_dataplus._M_p,
                    CONCAT44(local_660.m_name.field_2._M_allocated_capacity._4_4_,
                             local_660.m_name.field_2._M_allocated_capacity._0_4_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_258._M_dataplus._M_p != &local_258.field_2) {
    operator_delete(local_258._M_dataplus._M_p,
                    CONCAT71(local_258.field_2._M_allocated_capacity._1_7_,
                             local_258.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_300._M_dataplus._M_p != &local_300.field_2) {
    operator_delete(local_300._M_dataplus._M_p,(ulong)(local_300.field_2._M_allocated_capacity + 1))
    ;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) {
    operator_delete(local_2c0._M_dataplus._M_p,
                    CONCAT17(local_2c0.field_2._M_local_buf[7],
                             local_2c0.field_2._M_allocated_capacity._0_7_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_528._M_p != &local_518) {
    operator_delete(local_528._M_p,local_518._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_548._M_p != &local_538) {
    operator_delete(local_548._M_p,local_538._M_allocated_capacity + 1);
  }
  if (local_568 != (undefined1  [8])(auStack_560 + 8)) {
    operator_delete((void *)local_568,
                    CONCAT44(aStack_558._M_allocated_capacity._4_4_,
                             aStack_558._M_allocated_capacity._0_4_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
    operator_delete(local_2a0._M_dataplus._M_p,
                    CONCAT71(local_2a0.field_2._M_allocated_capacity._1_7_,
                             local_2a0.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_380._M_dataplus._M_p != &local_380.field_2) {
    operator_delete(local_380._M_dataplus._M_p,(ulong)(local_380.field_2._M_allocated_capacity + 1))
    ;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_320._M_dataplus._M_p != &local_320.field_2) {
    operator_delete(local_320._M_dataplus._M_p,
                    CONCAT17(local_320.field_2._M_local_buf[7],
                             local_320.field_2._M_allocated_capacity._0_7_) + 1);
  }
  if ((0.5 < fVar37) || (fVar37 < 0.1)) {
    local_568 = (undefined1  [8])
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)auStack_560);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_560,"Wait time is",0xc);
    pcVar28 = " NOT";
    if (0.5 < fVar37) {
      pcVar28 = ::glcts::fixed_sample_locations_values + 1;
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)auStack_560,pcVar28,(ulong)(fVar37 <= 0.5) << 2);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)auStack_560," correlated to rendering workload size.",0x27);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_568,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  else {
    local_568 = (undefined1  [8])
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)auStack_560);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)auStack_560,
               "Warning: Wait time correlation to rendering workload size is unclear.",0x45);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_568,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)auStack_560);
  std::ios_base::~ios_base(local_4f0);
  if ((0.5 < (float)local_5f8) || (fStack_674 < 0.1)) {
    local_568 = (undefined1  [8])
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)auStack_560);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_560,"Read time is",0xc);
    pcVar28 = " NOT";
    if (0.5 < (float)local_5f8) {
      pcVar28 = ::glcts::fixed_sample_locations_values + 1;
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)auStack_560,pcVar28,(ulong)((float)local_5f8 <= 0.5) << 2);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)auStack_560," correlated to rendering workload size.",0x27);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_568,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  else {
    local_568 = (undefined1  [8])
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)auStack_560);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)auStack_560,
               "Warning: Read time correlation to rendering workload size is unclear.",0x45);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_568,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)auStack_560);
  std::ios_base::~ios_base(local_4f0);
  bVar14 = true;
  bVar10 = true;
  do {
    fVar34 = fVar37;
    if (!bVar10) {
      fVar34 = (float)local_5f8;
    }
    pcVar28 = "render and read";
    if (bVar10) {
      pcVar28 = "Finish and wait";
    }
    fVar4 = (&this->m_waitThreshold)[(ulong)(byte)~bVar10 * 2];
    if ((&this->m_waitBehavior)[(ulong)(byte)~bVar10 * 2] == EXPECT_COEF_GREATER_THAN) {
      __s = "greater than";
      if (fVar34 <= fVar4) goto LAB_0127bf1b;
    }
    else {
      __s = "less than";
      if ((&this->m_waitBehavior)[(ulong)(byte)~bVar10 * 2] == EXPECT_COEF_LESS_THAN) {
        if (fVar34 < fVar4) goto LAB_0127c01b;
      }
      else {
        __s = (char *)0x0;
      }
LAB_0127bf1b:
      local_568 = (undefined1  [8])
                  ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)auStack_560);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)auStack_560,"ERROR: Expected ",0x10);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_560,pcVar28 + 0xb,4);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)auStack_560," coefficient to be ",0x13);
      if (__s == (char *)0x0) {
        std::ios::clear((int)auStack_560 +
                        (int)*(undefined8 *)(CONCAT44(auStack_560._4_4_,auStack_560._0_4_) + -0x18))
        ;
      }
      else {
        sVar26 = strlen(__s);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_560,__s,sVar26);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_560," ",1);
      std::ostream::_M_insert<double>((double)fVar4);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_568,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)auStack_560);
      std::ios_base::~ios_base(local_4f0);
      bVar14 = false;
    }
LAB_0127c01b:
    bVar11 = !bVar10;
    bVar10 = false;
    if (bVar11) {
      pcVar28 = "Suspicious performance behavior";
      if (bVar14) {
        pcVar28 = "Pass";
      }
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                 (byte)~bVar14 & QP_TEST_RESULT_FAIL,pcVar28);
      if (local_238.
          super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>._M_impl
          .super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_238.
                        super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_238.
                              super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_238.
                              super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if (local_220.
          super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>._M_impl
          .super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_220.
                        super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_220.
                              super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_220.
                              super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if (local_580.
          super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::FlushFinishCase::Sample,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::FlushFinishCase::Sample>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_580.
                        super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::FlushFinishCase::Sample,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::FlushFinishCase::Sample>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_580.
                              super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::FlushFinishCase::Sample,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::FlushFinishCase::Sample>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_580.
                              super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::FlushFinishCase::Sample,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::FlushFinishCase::Sample>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      return STOP;
    }
  } while( true );
}

Assistant:

FlushFinishCase::IterateResult FlushFinishCase::iterate (void)
{
	vector<Sample>		samples		(NUM_SAMPLES);
	CalibrationParams	params;

	tcu::warmupCPU();

	setupRenderState();

	// Do one full render cycle.
	{
		setShaderIterCount(1);
		render(1);
		readPixels();
	}

	// Calibrate.
	for (int calibrationRoundNdx = 0; /* until done */; calibrationRoundNdx++)
	{
		try
		{
			m_testCtx.touchWatchdog();
			params = calibrate();
			verifyCalibration(params);
			break;
		}
		catch (const CalibrationFailedException& e)
		{
			m_testCtx.getLog() << e;

			if (calibrationRoundNdx < MAX_CALIBRATION_ATTEMPTS)
			{
				m_testCtx.getLog() << TestLog::Message
								   << "Retrying calibration (" << (calibrationRoundNdx+1) << " / " << (int)MAX_CALIBRATION_ATTEMPTS << ")"
								   << TestLog::EndMessage;
			}
			else
			{
				m_testCtx.setTestResult(QP_TEST_RESULT_COMPATIBILITY_WARNING, e.what());
				return STOP;
			}
		}
	}

	// Do measurement.
	{
		de::Random	rnd		(123);

		setShaderIterCount(params.numItersInShader);

		for (size_t ndx = 0; ndx < samples.size(); ndx++)
		{
			const int		drawCallCount	= rnd.getInt(1, params.maxDrawCalls);
			const deUint64	submitStartTime	= deGetMicroseconds();
			deUint64		waitStartTime;
			deUint64		readStartTime;
			deUint64		readFinishTime;

			render(drawCallCount);

			waitStartTime = deGetMicroseconds();
			waitForGL();

			readStartTime = deGetMicroseconds();
			readPixels();
			readFinishTime = deGetMicroseconds();

			samples[ndx].numDrawCalls	= drawCallCount;
			samples[ndx].submitTime		= waitStartTime-submitStartTime;
			samples[ndx].waitTime		= readStartTime-waitStartTime;
			samples[ndx].readPixelsTime	= readFinishTime-readStartTime;

			m_testCtx.touchWatchdog();
		}
	}

	// Analyze - sets test case result.
	analyzeResults(samples, params);

	return STOP;
}